

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIViewController.cpp
# Opt level: O3

void __thiscall CLIViewController::showResult(CLIViewController *this,bool win)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  
  if ((int)CONCAT71(in_register_00000031,win) == 0) {
    pcVar4 = "Game Over";
    lVar3 = 9;
  }
  else {
    pcVar4 = "-=Congraduations ! You Win=-";
    lVar3 = 0x1c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  showScore(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Left : Restart",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Right : Exit",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void CLIViewController::showResult(bool win) {
	using namespace std;
	if (win) {
		cout << "-=Congraduations ! You Win=-";
	}
	else {
		cout << "Game Over";
	}
	cout << endl << endl << endl;
	showScore();
	cout << "Left : Restart" << endl << " Right : Exit" << endl;
}